

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# codegen.cpp
# Opt level: O2

statement_base * __thiscall
cs::method_continue::translate
          (method_continue *this,context_t *context,
          deque<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
          *raw)

{
  _Elt_pointer pdVar1;
  statement_base *this_00;
  _Elt_pointer pptVar2;
  __shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2> _Stack_28;
  
  this_00 = (statement_base *)statement_base::operator_new((statement_base *)0x20,(size_t)context);
  std::__shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>::__shared_ptr
            (&_Stack_28,&context->super___shared_ptr<cs::context_type,_(__gnu_cxx::_Lock_policy)2>);
  pdVar1 = (raw->
           super__Deque_base<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>,_std::allocator<std::deque<cs::token_base_*,_std::allocator<cs::token_base_*>_>_>_>
           )._M_impl.super__Deque_impl_data._M_start._M_cur;
  pptVar2 = (pdVar1->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl
            .super__Deque_impl_data._M_finish._M_cur;
  if (pptVar2 ==
      (pdVar1->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>)._M_impl.
      super__Deque_impl_data._M_finish._M_first) {
    pptVar2 = (pdVar1->super__Deque_base<cs::token_base_*,_std::allocator<cs::token_base_*>_>).
              _M_impl.super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
  }
  statement_continue::statement_continue
            ((statement_continue *)this_00,(context_t *)&_Stack_28,pptVar2[-1]);
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_28._M_refcount);
  return this_00;
}

Assistant:

statement_base *
	method_continue::translate(const context_t &context, const std::deque<std::deque<token_base *>> &raw)
	{
		return new statement_continue(context, raw.front().back());
	}